

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::Name,std::allocator<wasm::Name>>,(wasm
::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,std::
vector<wasm::Name,std::allocator<wasm::Name>>&)>)::Mapper::doWalkFunction(wasm::Function__
          (void *this,Function *curr)

{
  _Rb_tree_header *p_Var1;
  map<wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  *this_00;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  Function *local_28;
  Function *local_20;
  Function *curr_local;
  
  this_00 = *(map<wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
              **)((long)this + 0x138);
  p_Var2 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_20 = curr;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this_00->_M_t)._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (*(Function **)(p_Var2 + 1) >= curr) {
        p_Var4 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(Function **)(p_Var2 + 1) < curr];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (*(Function **)(p_Var4 + 1) <= curr)) {
      pmVar3 = std::
               map<wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               ::operator[](this_00,&local_20);
      local_28 = curr;
      if (*(long *)((long)this + 0x150) != 0) {
        (**(code **)((long)this + 0x158))((long)this + 0x140,&local_28,pmVar3);
        return;
      }
      std::__throw_bad_function_call();
    }
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::Name>>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = std::vector<wasm::Name>, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }